

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

LengthInfo * __thiscall
spvtools::opt::analysis::Array::GetConstantLengthInfo
          (LengthInfo *__return_storage_ptr__,Array *this,uint32_t const_id,uint32_t length)

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_51;
  uint local_50;
  uint32_t local_4c;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> extra_words;
  uint32_t length_local;
  uint32_t const_id_local;
  Array *this_local;
  
  local_50 = 0;
  local_48 = &local_50;
  local_40 = 2;
  local_4c = length;
  extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = length;
  extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = const_id;
  std::allocator<unsigned_int>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,__l,&local_51);
  std::allocator<unsigned_int>::~allocator(&local_51);
  __return_storage_ptr__->id =
       extra_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&__return_storage_ptr__->words,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Array::LengthInfo Array::GetConstantLengthInfo(uint32_t const_id,
                                               uint32_t length) const {
  std::vector<uint32_t> extra_words{LengthInfo::Case::kConstant, length};
  return {const_id, extra_words};
}